

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t derTOCTDec2(octet *val,octet *der,size_t count,u32 tag,size_t len)

{
  size_t sVar1;
  octet *v;
  octet *local_20;
  
  sVar1 = derDec3(&local_20,der,count,tag,len);
  if (val != (octet *)0x0 && sVar1 != 0xffffffffffffffff) {
    memMove(val,local_20,len);
  }
  return sVar1;
}

Assistant:

size_t derTOCTDec2(octet* val, const octet der[], size_t count, u32 tag,
	size_t len)
{
	const octet* v;
	count = derDec3(&v, der, count, tag, len);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	if (val)
		memMove(val, v, len);
	return count;
}